

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O1

Bounds3f * __thiscall pbrt::Curve::Bounds(Bounds3f *__return_storage_ptr__,Curve *this)

{
  Float FVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  CurveCommon *pCVar4;
  float fVar5;
  undefined1 auVar6 [16];
  size_t in_RCX;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  span<const_pbrt::Point3<float>_> cp;
  Bounds3<float> local_30;
  
  cp.n = in_RCX;
  cp.ptr = (Point3<float> *)0x4;
  BoundCubicBezier<pbrt::Bounds3<float>,pbrt::Point3<float>>
            (&local_30,(pbrt *)this->common->cpObj,cp,this->uMin,this->uMax);
  pCVar4 = this->common;
  uVar2 = this->uMin;
  uVar3 = this->uMax;
  auVar8._4_4_ = uVar3;
  auVar8._0_4_ = uVar2;
  auVar8._8_8_ = 0;
  auVar9._8_4_ = 0x3f800000;
  auVar9._0_8_ = 0x3f8000003f800000;
  auVar9._12_4_ = 0x3f800000;
  auVar9 = vsubps_avx(auVar9,auVar8);
  FVar1 = pCVar4->width[1];
  auVar7._4_4_ = FVar1;
  auVar7._0_4_ = FVar1;
  auVar7._8_4_ = FVar1;
  auVar7._12_4_ = FVar1;
  auVar7 = vmulps_avx512vl(auVar8,auVar7);
  FVar1 = pCVar4->width[0];
  auVar6._4_4_ = FVar1;
  auVar6._0_4_ = FVar1;
  auVar6._8_4_ = FVar1;
  auVar6._12_4_ = FVar1;
  auVar7 = vfmadd231ps_avx512vl(auVar7,auVar9,auVar6);
  auVar9 = vmovshdup_avx(auVar7);
  auVar9 = vmaxss_avx(auVar9,auVar7);
  fVar5 = auVar9._0_4_ * 0.5;
  auVar10._8_8_ = 0;
  auVar10._0_4_ = local_30.pMin.super_Tuple3<pbrt::Point3,_float>.x;
  auVar10._4_4_ = local_30.pMin.super_Tuple3<pbrt::Point3,_float>.y;
  auVar11._4_4_ = fVar5;
  auVar11._0_4_ = fVar5;
  auVar11._8_4_ = fVar5;
  auVar11._12_4_ = fVar5;
  auVar9 = vsubps_avx(auVar10,auVar11);
  local_30.pMin.super_Tuple3<pbrt::Point3,_float>.z =
       local_30.pMin.super_Tuple3<pbrt::Point3,_float>.z - fVar5;
  auVar12._0_4_ = local_30.pMax.super_Tuple3<pbrt::Point3,_float>.x + fVar5;
  auVar12._4_4_ = local_30.pMax.super_Tuple3<pbrt::Point3,_float>.y + fVar5;
  auVar12._8_4_ = fVar5 + 0.0;
  auVar12._12_4_ = fVar5 + 0.0;
  local_30.pMax.super_Tuple3<pbrt::Point3,_float>.z =
       fVar5 + local_30.pMax.super_Tuple3<pbrt::Point3,_float>.z;
  local_30.pMin.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar9);
  local_30.pMax.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar12);
  Transform::operator()(__return_storage_ptr__,pCVar4->renderFromObject,&local_30);
  return __return_storage_ptr__;
}

Assistant:

Bounds3f Curve::Bounds() const {
    pstd::span<const Point3f> cpSpan(common->cpObj);
    Bounds3f objBounds = BoundCubicBezier<Bounds3f>(cpSpan, uMin, uMax);
    // Expand _objBounds_ by maximum curve width over $u$ range
    Float width[2] = {Lerp(uMin, common->width[0], common->width[1]),
                      Lerp(uMax, common->width[0], common->width[1])};
    objBounds = Expand(objBounds, std::max(width[0], width[1]) * 0.5f);

    return (*common->renderFromObject)(objBounds);
}